

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,ScopedMessage *old)

{
  ScopedMessage *old_local;
  ScopedMessage *this_local;
  
  MessageInfo::MessageInfo(&this->m_info,&old->m_info);
  this->m_moved = false;
  old->m_moved = true;
  return;
}

Assistant:

ScopedMessage::ScopedMessage( ScopedMessage&& old )
    : m_info( old.m_info ), m_moved()
    {
        old.m_moved = true;
    }